

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O3

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::HandleBeginObject
          (Status *__return_storage_ptr__,JsonStreamParser *this)

{
  _Elt_pointer pPVar1;
  LogMessage *other;
  undefined1 local_60 [8];
  Status status;
  ParseType local_24;
  
  if (*(this->p_).ptr_ != '{') {
    protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/util/internal/json_stream_parser.cc"
               ,0x286);
    other = protobuf::internal::LogMessage::operator<<
                      ((LogMessage *)local_60,"CHECK failed: (\'{\') == (*p_.data()): ");
    protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_24,other);
    protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_60);
  }
  Advance(this);
  (*this->ow_->_vptr_ObjectWriter[2])(this->ow_,(this->key_).ptr_,(this->key_).length_);
  IncrementRecursionDepth((Status *)local_60,this,this->key_);
  if (local_60._0_4_ == LOGLEVEL_INFO) {
    (this->key_).ptr_ = (char *)0x0;
    (this->key_).length_ = 0;
    local_24 = ENTRY;
    pPVar1 = (this->stack_).c.
             super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pPVar1 == (this->stack_).c.
                  super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::
      deque<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
      ::_M_push_back_aux<google::protobuf::util::converter::JsonStreamParser::ParseType>
                (&(this->stack_).c,&local_24);
    }
    else {
      *pPVar1 = ENTRY;
      (this->stack_).c.
      super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur = pPVar1 + 1;
    }
    Status::Status(__return_storage_ptr__);
  }
  else {
    Status::Status(__return_storage_ptr__,(Status *)local_60);
  }
  if ((size_type *)status._0_8_ != &status.error_message_._M_string_length) {
    operator_delete((void *)status._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::HandleBeginObject() {
  GOOGLE_DCHECK_EQ('{', *p_.data());
  Advance();
  ow_->StartObject(key_);
  auto status = IncrementRecursionDepth(key_);
  if (!status.ok()) {
    return status;
  }
  key_ = StringPiece();
  stack_.push(ENTRY);
  return util::Status();
}